

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

uint32_t WriteBinaryMaterialProperty(aiMaterialProperty *prop)

{
  uint uVar1;
  long lVar2;
  size_t sVar3;
  uint32_t n;
  uint32_t t;
  undefined1 local_24 [4];
  
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  lVar2 = ftell((FILE *)out);
  uVar1 = (prop->mKey).length;
  fwrite(prop,4,1,(FILE *)out);
  fwrite((prop->mKey).data,(ulong)uVar1,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  sVar3 = fwrite(prop->mData,1,(ulong)prop->mDataLength,(FILE *)out);
  n = uVar1 + (int)sVar3 + 0x14;
  ChangeInteger((int)lVar2 - 4,n);
  return n;
}

Assistant:

uint32_t WriteBinaryMaterialProperty(const aiMaterialProperty* prop)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMATERIALPROPERTY);

	len += Write<aiString>(prop->mKey);
	len += Write<unsigned int>(prop->mSemantic);
	len += Write<unsigned int>(prop->mIndex);

	len += Write<unsigned int>(prop->mDataLength);
	len += Write<unsigned int>((unsigned int)prop->mType);
	len += static_cast<uint32_t>(fwrite(prop->mData,1,prop->mDataLength,out));

	ChangeInteger(old,len);
	return len;
}